

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_get_handshake_transcript
              (mbedtls_ssl_context *ssl,mbedtls_md_type_t md,uchar *dst,size_t dst_len,size_t *olen)

{
  int ret;
  mbedtls_md_info_t *md_info;
  mbedtls_md_context_t local_40;
  
  ret = -0x6c00;
  if ((md == MBEDTLS_MD_SHA256) && (0x1f < dst_len)) {
    mbedtls_md_init(&local_40);
    md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
    ret = mbedtls_md_setup(&local_40,md_info,0);
    if ((ret == 0) && (ret = mbedtls_md_clone(&local_40,&ssl->handshake->fin_sha256), ret == 0)) {
      ret = mbedtls_md_finish(&local_40,dst);
      if (ret == 0) {
        *olen = 0x20;
        ret = 0;
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x16d7,"mbedtls_md_finish",ret);
      }
    }
    mbedtls_md_free(&local_40);
  }
  return ret;
}

Assistant:

int mbedtls_ssl_get_handshake_transcript(mbedtls_ssl_context *ssl,
                                         const mbedtls_md_type_t md,
                                         unsigned char *dst,
                                         size_t dst_len,
                                         size_t *olen)
{
    switch (md) {

#if defined(MBEDTLS_MD_CAN_SHA384)
        case MBEDTLS_MD_SHA384:
            return ssl_get_handshake_transcript_sha384(ssl, dst, dst_len, olen);
#endif /* MBEDTLS_MD_CAN_SHA384*/

#if defined(MBEDTLS_MD_CAN_SHA256)
        case MBEDTLS_MD_SHA256:
            return ssl_get_handshake_transcript_sha256(ssl, dst, dst_len, olen);
#endif /* MBEDTLS_MD_CAN_SHA256*/

        default:
#if !defined(MBEDTLS_MD_CAN_SHA384) && \
            !defined(MBEDTLS_MD_CAN_SHA256)
            (void) ssl;
            (void) dst;
            (void) dst_len;
            (void) olen;
#endif
            break;
    }
    return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
}